

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall QMdiSubWindowPrivate::updateGeometryConstraints(QMdiSubWindowPrivate *this)

{
  bool bVar1;
  Int IVar2;
  QMdiSubWindowPrivate *this_00;
  QMdiSubWindowPrivate *in_RDI;
  long in_FS_OFFSET;
  QMdiSubWindow *q;
  int minWidth;
  int margin;
  WindowType in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb8;
  int left;
  QMdiSubWindowPrivate *pQVar3;
  QFlagsStorageHelper<Qt::WindowType,_4> local_24;
  undefined4 local_20;
  int local_1c;
  QSize local_18;
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = in_RDI;
  this_00 = (QMdiSubWindowPrivate *)q_func(in_RDI);
  if (*(long *)&(in_RDI->super_QWidgetPrivate).field_0x10 == 0) goto LAB_0062f367;
  bVar1 = QWidget::isMinimized((QWidget *)this_00);
  if (bVar1) {
LAB_0062f22f:
    local_10 = (QSize)(**(code **)(*(long *)&this_00->super_QWidgetPrivate + 0x78))();
  }
  else {
    local_18 = QWidget::minimumSize((QWidget *)in_RDI);
    bVar1 = QSize::isNull((QSize *)in_RDI);
    if (bVar1) goto LAB_0062f22f;
    local_10 = QWidget::minimumSize((QWidget *)in_RDI);
  }
  in_RDI->internalMinimumSize = local_10;
  local_1c = -0x55555556;
  local_20 = 0xaaaaaaaa;
  sizeParameters(pQVar3,(int *)this_00,(int *)in_RDI);
  left = local_1c;
  pQVar3 = this_00;
  titleBarHeight(this_00);
  QWidget::setContentsMargins
            ((QWidget *)in_RDI,left,in_stack_ffffffffffffffb8,(int)((ulong)this_00 >> 0x20),
             (int)this_00);
  bVar1 = QWidget::isMaximized((QWidget *)pQVar3);
  if ((bVar1) ||
     ((bVar1 = QWidget::isMinimized((QWidget *)pQVar3), bVar1 &&
      (bVar1 = QMdiSubWindow::isShaded((QMdiSubWindow *)0x62f2cc), !bVar1)))) {
    in_RDI->moveEnabled = false;
    in_RDI->resizeEnabled = false;
  }
  else {
    in_RDI->moveEnabled = true;
    QWidget::windowFlags((QWidget *)this_00);
    local_24.super_QFlagsStorage<Qt::WindowType>.i =
         (QFlagsStorage<Qt::WindowType>)
         QFlags<Qt::WindowType>::operator&
                   ((QFlags<Qt::WindowType> *)this_00,in_stack_ffffffffffffffac);
    IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_24);
    bVar1 = true;
    if (IVar2 == 0) {
      bVar1 = QMdiSubWindow::isShaded((QMdiSubWindow *)0x62f333);
    }
    if (bVar1 == false) {
      in_RDI->resizeEnabled = true;
    }
    else {
      in_RDI->resizeEnabled = false;
    }
  }
  updateDirtyRegions(this_00);
LAB_0062f367:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiSubWindowPrivate::updateGeometryConstraints()
{
    Q_Q(QMdiSubWindow);
    if (!parent)
        return;

    internalMinimumSize = (!q->isMinimized() && !q->minimumSize().isNull())
                          ? q->minimumSize() : q->minimumSizeHint();
    int margin, minWidth;
    sizeParameters(&margin, &minWidth);
    q->setContentsMargins(margin, titleBarHeight(), margin, margin);
    if (q->isMaximized() || (q->isMinimized() && !q->isShaded())) {
        moveEnabled = false;
        resizeEnabled = false;
    } else {
        moveEnabled = true;
        if ((q->windowFlags() & Qt::MSWindowsFixedSizeDialogHint) || q->isShaded())
            resizeEnabled = false;
        else
            resizeEnabled = true;
    }
    updateDirtyRegions();
}